

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

aspa_status
aspa_array_insert_internal(aspa_array *array,size_t index,aspa_record *record,_Bool copy_providers)

{
  long lVar1;
  undefined4 uVar2;
  aspa_status aVar3;
  size_t size;
  aspa_record *paVar4;
  long in_FS_OFFSET;
  size_t trailing;
  size_t provider_size;
  uint32_t *provider_asns;
  _Bool copy_providers_local;
  aspa_record *record_local;
  size_t index_local;
  aspa_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)array->size < array->capacity) ||
     (aVar3 = aspa_array_reallocate(array), aVar3 == ASPA_SUCCESS)) {
    provider_size = 0;
    if (record->provider_count != 0) {
      if (copy_providers) {
        size = record->provider_count << 2;
        provider_size = (size_t)lrtr_malloc(size);
        if ((void *)provider_size == (void *)0x0) {
          array_local._4_4_ = ASPA_ERROR;
          goto LAB_0010b407;
        }
        memcpy((void *)provider_size,record->provider_asns,size);
      }
      else {
        provider_size = (size_t)record->provider_asns;
      }
    }
    if (index < array->size) {
      memmove(array->data + index + 1,array->data + index,(array->size - index) * 0x18);
    }
    paVar4 = array->data + index;
    uVar2 = *(undefined4 *)&record->field_0x4;
    paVar4->customer_asn = record->customer_asn;
    *(undefined4 *)&paVar4->field_0x4 = uVar2;
    paVar4->provider_count = record->provider_count;
    paVar4->provider_asns = record->provider_asns;
    array->data[index].provider_asns = (uint32_t *)provider_size;
    array->size = array->size + 1;
    array_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    array_local._4_4_ = ASPA_ERROR;
  }
LAB_0010b407:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return array_local._4_4_;
}

Assistant:

static enum aspa_status aspa_array_insert_internal(struct aspa_array *array, size_t index, struct aspa_record *record,
						   bool copy_providers)
{
	// check if this element will fit into the array
	if (array->size >= array->capacity) {
		// increasing the array's size so the new element fits
		if (aspa_array_reallocate(array) != ASPA_SUCCESS)
			return ASPA_ERROR;
	}

	uint32_t *provider_asns = NULL;

	if (record->provider_count > 0) {
		if (copy_providers) {
			size_t provider_size = record->provider_count * sizeof(uint32_t);

			provider_asns = lrtr_malloc(provider_size);
			if (!provider_asns)
				return ASPA_ERROR;

			memcpy(provider_asns, record->provider_asns, provider_size);
		} else {
			provider_asns = record->provider_asns;
		}
	}

	// No need to move if last element
	if (index < array->size) {
		size_t trailing = (array->size - index) * sizeof(struct aspa_record);

		/*               trailing
		 *		     /-------------\
		 * #3 #8 #11 #24 #30 #36 #37
		 * #3 #8 #11  *  #24 #30 #36 #37
		 *            ^   ^
		 *		index   index + 1
		 */
		memmove(&array->data[index + 1], &array->data[index], trailing);
	}

	// append the record at the end
	array->data[index] = *record;
	array->data[index].provider_asns = provider_asns;
	array->size += 1;

	return ASPA_SUCCESS;
}